

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapWalk(jx9_hashmap *pMap,_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk,
                    void *pUserData)

{
  int iVar1;
  sxu32 local_b8;
  sxu32 n;
  sxi32 rc;
  jx9_value sValue;
  jx9_value sKey;
  jx9_hashmap_node *pEntry;
  void *pUserData_local;
  _func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk_local;
  jx9_hashmap *pMap_local;
  
  jx9MemObjInit(pMap->pVm,(jx9_value *)&sValue.nIdx);
  jx9MemObjInit(pMap->pVm,(jx9_value *)&n);
  local_b8 = pMap->nEntry;
  sKey._56_8_ = pMap->pFirst;
  while( true ) {
    if (local_b8 == 0) {
      return 0;
    }
    jx9HashmapExtractNodeKey((jx9_hashmap_node *)sKey._56_8_,(jx9_value *)&sValue.nIdx);
    jx9HashmapExtractNodeValue((jx9_hashmap_node *)sKey._56_8_,(jx9_value *)&n,0);
    iVar1 = (*xWalk)((jx9_value *)&sValue.nIdx,(jx9_value *)&n,pUserData);
    jx9MemObjRelease((jx9_value *)&sValue.nIdx);
    jx9MemObjRelease((jx9_value *)&n);
    if (iVar1 != 0) break;
    sKey._56_8_ = *(undefined8 *)(sKey._56_8_ + 0x48);
    local_b8 = local_b8 - 1;
  }
  return -10;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapWalk(
	jx9_hashmap *pMap, /* Target hashmap */
	int (*xWalk)(jx9_value *, jx9_value *, void *), /* Walker callback */
	void *pUserData /* Last argument to xWalk() */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sKey, sValue;
	sxi32 rc;
	sxu32 n;
	/* Initialize walker parameter */
	rc = SXRET_OK;
	jx9MemObjInit(pMap->pVm, &sKey);
	jx9MemObjInit(pMap->pVm, &sValue);
	n = pMap->nEntry;
	pEntry = pMap->pFirst;
	/* Start the iteration process */
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract a copy of the key and a copy the current value */
		jx9HashmapExtractNodeKey(pEntry, &sKey);
		jx9HashmapExtractNodeValue(pEntry, &sValue, FALSE);
		/* Invoke the user callback */
		rc = xWalk(&sKey, &sValue, pUserData);
		/* Release the copy of the key and the value */
		jx9MemObjRelease(&sKey);
		jx9MemObjRelease(&sValue);
		if( rc != JX9_OK ){
			/* Callback request an operation abort */
			return SXERR_ABORT;
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* All done */
	return SXRET_OK;
}